

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  string *str;
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  allocator local_49;
  string local_48 [32];
  string *local_28;
  string *line_local;
  ifstream *ifile_local;
  HMMModel *this_local;
  
  local_28 = (string *)line;
  line_local = (string *)ifile;
  ifile_local = (ifstream *)this;
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)line_local,local_28);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) {
        return false;
      }
      limonp::Trim((string *)local_28);
      uVar3 = std::__cxx11::string::empty();
      str = local_28;
    } while ((uVar3 & 1) != 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"#",&local_49);
    bVar1 = limonp::StartsWith((string *)str,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  } while (bVar1);
  return true;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }